

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

Int64ToDoubleMap * __thiscall
CoreML::Specification::Int64ToDoubleMap::New(Int64ToDoubleMap *this,Arena *arena)

{
  Int64ToDoubleMap *this_00;
  
  this_00 = (Int64ToDoubleMap *)operator_new(0x38);
  Int64ToDoubleMap(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::Int64ToDoubleMap>(arena,this_00);
  }
  return this_00;
}

Assistant:

Int64ToDoubleMap* Int64ToDoubleMap::New(::google::protobuf::Arena* arena) const {
  Int64ToDoubleMap* n = new Int64ToDoubleMap;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}